

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

string * phosg::JSON::escape_string(string *__return_storage_ptr__,string *s,StringEscapeMode mode)

{
  bool bVar1;
  byte *pbVar2;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  byte local_39;
  const_iterator cStack_38;
  char ch;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  StringEscapeMode mode_local;
  string *s_local;
  string *ret;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end1 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                     (s);
  cStack_38 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                        (s);
  while (bVar1 = __gnu_cxx::
                 operator==<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           (&__end1,&stack0xffffffffffffffc8), ((bVar1 ^ 0xffU) & 1) != 0) {
    pbVar2 = (byte *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&__end1);
    local_39 = *pbVar2;
    if (local_39 == 0x22) {
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,"\\\"");
    }
    else if (local_39 == 0x5c) {
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,"\\\\");
    }
    else if (local_39 == 8) {
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,"\\b");
    }
    else if (local_39 == 0xc) {
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,"\\f");
    }
    else if (local_39 == 10) {
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,"\\n");
    }
    else if (local_39 == 0xd) {
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,"\\r");
    }
    else if (local_39 == 9) {
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,"\\t");
    }
    else if (local_39 < 0x20) {
      if (mode == STANDARD) {
        string_printf_abi_cxx11_(&local_90,"\\u%04hhX",(ulong)(uint)(int)(char)local_39);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90);
        ::std::__cxx11::string::~string((string *)&local_90);
      }
      else {
        string_printf_abi_cxx11_(&local_70,"\\x%02hhX",(ulong)(uint)(int)(char)local_39);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70);
        ::std::__cxx11::string::~string((string *)&local_70);
      }
    }
    else if (local_39 < 0x7f) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,local_39);
    }
    else if (mode == CONTROL_ONLY) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,local_39);
    }
    else if (mode == HEX) {
      string_printf_abi_cxx11_(&local_b0,"\\x%02hhX",(ulong)(uint)(int)(char)local_39);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0);
      ::std::__cxx11::string::~string((string *)&local_b0);
    }
    else {
      string_printf_abi_cxx11_(&local_d0,"\\u%04hhX",(ulong)(uint)(int)(char)local_39);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0);
      ::std::__cxx11::string::~string((string *)&local_d0);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

string JSON::escape_string(const string& s, StringEscapeMode mode) {
  string ret;
  for (auto ch : s) {
    if (ch == '\"') {
      ret += "\\\"";
    } else if (ch == '\\') {
      ret += "\\\\";
    } else if (ch == '\b') {
      ret += "\\b";
    } else if (ch == '\f') {
      ret += "\\f";
    } else if (ch == '\n') {
      ret += "\\n";
    } else if (ch == '\r') {
      ret += "\\r";
    } else if (ch == '\t') {
      ret += "\\t";
    } else if (static_cast<uint8_t>(ch) < 0x20) {
      if (mode != StringEscapeMode::STANDARD) {
        ret += string_printf("\\x%02hhX", ch);
      } else {
        ret += string_printf("\\u%04hhX", ch);
      }
    } else if (static_cast<uint8_t>(ch) > 0x7E) {
      if (mode == StringEscapeMode::CONTROL_ONLY) {
        ret += ch;
      } else if (mode == StringEscapeMode::HEX) {
        ret += string_printf("\\x%02hhX", ch);
      } else {
        ret += string_printf("\\u%04hhX", ch);
      }
    } else {
      ret += ch;
    }
  }
  return ret;
}